

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<long>(uint length)

{
  long lVar1;
  long *__p;
  element_type *pSrc;
  long lVar2;
  undefined8 *puVar3;
  int local_40;
  int i_1;
  int local_2c;
  int i;
  long *v;
  shared_ptr<long> pv;
  uint length_local;
  
  pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = length;
  __p = nosimd::common::malloc<long>(length);
  std::shared_ptr<long>::shared_ptr<long,void(*)(long*),void>
            ((shared_ptr<long> *)&v,__p,nosimd::common::free<long>);
  pSrc = std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2c = 0;
      local_2c <
      (int)pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      local_2c = local_2c + 1) {
    pSrc[local_2c] = (long)-local_2c;
  }
  nosimd::arithmetic::abs<long>
            (pSrc,pSrc,
             pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_);
  local_40 = 0;
  do {
    if ((int)pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <=
        local_40) {
      std::shared_ptr<long>::~shared_ptr((shared_ptr<long> *)&v);
      return;
    }
    if (pSrc[local_40] < 0) {
      lVar1 = pSrc[local_40];
      lVar2 = std::numeric_limits<long>::min();
      if (lVar1 != lVar2) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_abs(unsigned int) [T = long]";
        *(undefined4 *)(puVar3 + 1) = 0x81;
        *(uint *)((long)puVar3 + 0xc) =
             pv.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}